

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZCircBufferedStream.cpp
# Opt level: O1

void __thiscall TPZCircBufferedStream::Print(TPZCircBufferedStream *this)

{
  bool bVar1;
  ostream *poVar2;
  void *pvVar3;
  ulong uVar4;
  ulong uVar5;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"fSize=",6);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  pvVar3 = operator_new__(this->fSize & 0xfffffffffffffff8);
  (*(this->super_TPZStream)._vptr_TPZStream[0x39])(this,pvVar3,&this->fSize);
  if (7 < this->fSize) {
    uVar4 = 0;
    uVar5 = 1;
    do {
      poVar2 = std::ostream::_M_insert<double>(*(double *)((long)pvVar3 + uVar4 * 8));
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
      bVar1 = uVar5 < this->fSize >> 3;
      uVar4 = uVar5;
      uVar5 = (ulong)((int)uVar5 + 1);
    } while (bVar1);
  }
  operator_delete__(pvVar3);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
  std::ostream::put(-0x58);
  std::ostream::flush();
  return;
}

Assistant:

void TPZCircBufferedStream::Print() {
    std::cout << "fSize=" << fSize << std::endl;
    double *temp = new double[fSize / 8];
    ConstRead(reinterpret_cast<char *>(temp), fSize);
    for (unsigned int i = 0; i < fSize / 8; ++i) {
        std::cout << temp[i] << " ";
    }
	delete[] temp;
    std::cout << std::endl;
}